

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcIShapeProfileDef::IfcIShapeProfileDef
          (IfcIShapeProfileDef *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,vtt + 1);
  pvVar1 = vtt[10];
  *(void **)&(this->super_IfcParameterizedProfileDef).field_0x70 = pvVar1;
  *(void **)(&(this->super_IfcParameterizedProfileDef).field_0x70 + *(long *)((long)pvVar1 + -0x18))
       = vtt[0xb];
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper = pp_Var2;
  *(void **)((long)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = vtt[0xd];
  *(void **)&(this->super_IfcParameterizedProfileDef).field_0x70 = vtt[0xe];
  (this->FilletRadius).have = false;
  return;
}

Assistant:

IfcIShapeProfileDef() : Object("IfcIShapeProfileDef") {}